

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O0

void __thiscall QProgressBar::paintEvent(QProgressBar *this,QPaintEvent *param_2)

{
  QProgressBarPrivate *pQVar1;
  long *in_RDI;
  long in_FS_OFFSET;
  QStylePainter paint;
  QStyleOptionProgressBar opt;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int iVar2;
  QWidget *in_stack_ffffffffffffff48;
  undefined1 **ppuVar3;
  undefined1 *local_98;
  QWidget *pQStack_90;
  QStyle *local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_90 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  QStylePainter::QStylePainter((QStylePainter *)&local_98,in_stack_ffffffffffffff48);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  ppuVar3 = &local_78;
  QStyleOptionProgressBar::QStyleOptionProgressBar((QStyleOptionProgressBar *)0x662dee);
  (**(code **)(*in_RDI + 0x1a8))(in_RDI,ppuVar3);
  QStylePainter::drawControl
            ((QStylePainter *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (ControlElement)((ulong)in_RDI >> 0x20),(QStyleOption *)0x662e17);
  pQVar1 = d_func((QProgressBar *)0x662e20);
  iVar2 = pQVar1->value;
  pQVar1 = d_func((QProgressBar *)0x662e33);
  pQVar1->lastPaintedValue = iVar2;
  QStyleOptionProgressBar::~QStyleOptionProgressBar
            ((QStyleOptionProgressBar *)CONCAT44(iVar2,in_stack_ffffffffffffff40));
  QStylePainter::~QStylePainter((QStylePainter *)0x662e51);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProgressBar::paintEvent(QPaintEvent *)
{
    QStylePainter paint(this);
    QStyleOptionProgressBar opt;
    initStyleOption(&opt);
    paint.drawControl(QStyle::CE_ProgressBar, opt);
    d_func()->lastPaintedValue = d_func()->value;
}